

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O2

int __thiscall fmt::v5::file::dup(file *this,int __fd)

{
  int iVar1;
  system_error *this_00;
  int *piVar2;
  size_t sVar3;
  string_view message;
  int fd_local;
  
  fd_local = __fd;
  iVar1 = ::dup(__fd);
  if (iVar1 != -1) {
    this->fd_ = iVar1;
    return (int)this;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  sVar3 = internal::length<char>("cannot duplicate file descriptor {}");
  message.size_ = sVar3;
  message.data_ = "cannot duplicate file descriptor {}";
  system_error::system_error<int>(this_00,iVar1,message,&fd_local);
  __cxa_throw(this_00,&system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

file file::dup(int fd) {
  // Don't retry as dup doesn't return EINTR.
  // http://pubs.opengroup.org/onlinepubs/009695399/functions/dup.html
  int new_fd = FMT_POSIX_CALL(dup(fd));
  if (new_fd == -1)
    FMT_THROW(system_error(errno, "cannot duplicate file descriptor {}", fd));
  return file(new_fd);
}